

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utAssbinImportExport.cpp
# Opt level: O0

void __thiscall utAssbinImportExport::utAssbinImportExport(utAssbinImportExport *this)

{
  utAssbinImportExport *this_local;
  
  AbstractImportExportBase::AbstractImportExportBase(&this->super_AbstractImportExportBase);
  (this->super_AbstractImportExportBase).super_Test._vptr_Test =
       (_func_int **)&PTR__utAssbinImportExport_0103d570;
  return;
}

Assistant:

bool importerTest() override {
        Importer importer;
        const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/OBJ/spider.obj", aiProcess_ValidateDataStructure );

        Exporter exporter;
        EXPECT_EQ( aiReturn_SUCCESS, exporter.Export( scene, "assbin", ASSIMP_TEST_MODELS_DIR "/OBJ/spider_out.assbin" ) );
        const aiScene *newScene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/OBJ/spider_out.assbin", aiProcess_ValidateDataStructure );

        return newScene != nullptr;
    }